

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::openDB(Database *this,string *fileName)

{
  int iVar1;
  ostream *poVar2;
  DatabaseException *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = sqlite3_open_v2((fileName->_M_dataplus)._M_p,&this->database,0x10002,(char *)0x0);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Database opened");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  iVar1 = sqlite3_errcode(this->database);
  std::__cxx11::to_string(&sStack_58,iVar1);
  std::operator+(&local_38,"SQLite error while opening database: ",&sStack_58);
  DatabaseException::DatabaseException(this_00,&local_38);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

void Database::openDB(std::string fileName)
{
	int failure = sqlite3_open_v2(fileName.c_str(), &database, SQLITE_OPEN_FULLMUTEX | SQLITE_OPEN_READWRITE, nullptr);

	if(failure)
	{
		throw DatabaseException("SQLite error while opening database: " + std::to_string(sqlite3_errcode(database)));
	}
	else
	{
		std::cout << "Database opened" << std::endl;
	}
}